

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void verify_stale_block_reuse_test(void)

{
  uint64_t uVar1;
  fdb_status fVar2;
  sb_decision_t sVar3;
  fdb_status extraout_EAX;
  fdb_config *fconfig_00;
  int extraout_EDX;
  uint uVar4;
  int iVar5;
  byte bVar6;
  char *pcVar7;
  undefined4 *puVar8;
  fdb_file_info *pfVar9;
  fdb_kvs_handle *__s;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *lazy;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_file_handle *pfStack_758;
  fdb_kvs_handle *pfStack_750;
  fdb_kvs_config fStack_748;
  timeval tStack_730;
  fdb_config fStack_720;
  fdb_file_info fStack_628;
  undefined4 auStack_5e0 [128];
  char acStack_3e0 [520];
  fdb_config *pfStack_1d8;
  fdb_file_handle *local_1a0;
  fdb_kvs_handle *local_198;
  fdb_kvs_config local_190;
  fdb_kvs_handle *local_178;
  timeval local_170;
  fdb_file_info local_160;
  fdb_config local_118;
  
  gettimeofday(&local_170,(__timezone_ptr_t)0x0);
  fconfig_00 = &local_118;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  local_118.compaction_threshold = '\0';
  local_118.block_reusing_threshold = 0x14;
  fVar2 = fdb_open(&local_1a0,"./staleblktest1",fconfig_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2d3;
  fVar2 = fdb_kvs_open_default(local_1a0,&local_198,&local_190);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2da;
  fconfig_00 = (fdb_config *)operator_new__(0x2800);
  memset(fconfig_00,0,0x2800);
  uVar4 = 0xfffffffe;
  do {
    fVar2 = fdb_set_kv(local_198,"key",4,fconfig_00,0x2800);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      verify_stale_block_reuse_test();
      goto LAB_0010b2c5;
    }
    uVar4 = uVar4 + 2;
  } while (uVar4 < 0xbb6);
  fVar2 = fdb_get_file_info(local_1a0,&local_160);
  uVar1 = local_160.file_size;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2e1;
  fVar2 = fdb_kvs_open(local_1a0,&local_178,"lazy",&local_190);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2e8;
  iVar5 = 1000;
  do {
    fVar2 = fdb_set_kv(local_198,"key",4,fconfig_00,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2cc;
    fVar2 = fdb_commit(local_1a0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2c5;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  fVar2 = fdb_get_file_info(local_1a0,&local_160);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b2ef;
  auVar11._8_4_ = (int)(local_160.file_size >> 0x20);
  auVar11._0_8_ = local_160.file_size;
  auVar11._12_4_ = 0x45300000;
  auVar12._8_4_ = (int)(uVar1 >> 0x20);
  auVar12._0_8_ = uVar1;
  auVar12._12_4_ = 0x45300000;
  if (((auVar12._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.3 <=
      (auVar11._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)local_160.file_size) - 4503599627370496.0))
  goto LAB_0010b2f6;
  operator_delete__(fconfig_00);
  fVar2 = fdb_close(local_1a0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcVar7 = "%s PASSED\n";
      if (verify_stale_block_reuse_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"basic stale block reuse test");
      return;
    }
    goto LAB_0010b302;
  }
  goto LAB_0010b2fb;
LAB_0010b2c5:
  verify_stale_block_reuse_test();
LAB_0010b2cc:
  verify_stale_block_reuse_test();
LAB_0010b2d3:
  verify_stale_block_reuse_test();
LAB_0010b2da:
  verify_stale_block_reuse_test();
LAB_0010b2e1:
  verify_stale_block_reuse_test();
LAB_0010b2e8:
  verify_stale_block_reuse_test();
LAB_0010b2ef:
  verify_stale_block_reuse_test();
LAB_0010b2f6:
  verify_stale_block_reuse_test();
LAB_0010b2fb:
  verify_stale_block_reuse_test();
LAB_0010b302:
  verify_stale_block_reuse_test();
  pfStack_1d8 = fconfig_00;
  gettimeofday(&tStack_730,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_720.compaction_threshold = '\0';
  fStack_720.block_reusing_threshold = 0x41;
  do {
    system("rm -rf  staleblktest* > errorlog.txt");
    fdb_open(&pfStack_758,"./staleblktest1",&fStack_720);
    fdb_kvs_open_default(pfStack_758,&pfStack_750,&fStack_748);
    if (fStack_720.num_keeping_headers != 0xffffffffffffffff) {
      uVar10 = 0;
      do {
        auStack_5e0[0] = 0x79656b;
        puVar8 = auStack_5e0;
        fVar2 = fdb_set_kv(pfStack_750,auStack_5e0,0x200,(void *)0x0,0);
        bVar6 = (byte)puVar8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b52f;
        bVar6 = 1;
        fVar2 = fdb_commit(pfStack_758,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010b536;
        uVar10 = uVar10 + 1;
      } while (uVar10 < fStack_720.num_keeping_headers + 1);
    }
    uVar10 = 0;
    do {
      auStack_5e0[0] = 0x79656b;
      sprintf(acStack_3e0,"body%d",uVar10);
      puVar8 = auStack_5e0;
      fVar2 = fdb_set_kv(pfStack_750,auStack_5e0,0x200,acStack_3e0,0x200);
      bVar6 = (byte)puVar8;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010b528:
        verify_staleblock_reuse_param_test();
LAB_0010b52f:
        verify_staleblock_reuse_param_test();
LAB_0010b536:
        verify_staleblock_reuse_param_test();
        fVar2 = extraout_EAX;
        goto LAB_0010b53d;
      }
      pfVar9 = &fStack_628;
      fVar2 = fdb_get_file_info(pfStack_758,&fStack_628);
      bVar6 = (byte)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        verify_staleblock_reuse_param_test();
        goto LAB_0010b528;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (fStack_628.file_size < 0x1000000);
    __s = pfStack_750;
    sVar3 = sb_check_block_reusing(pfStack_750);
    if (fStack_720.block_reusing_threshold == 0x41) {
      if (sVar3 == SBD_RECLAIM) goto LAB_0010b499;
LAB_0010b544:
      verify_staleblock_reuse_param_test();
LAB_0010b549:
      verify_staleblock_reuse_param_test();
      if (extraout_EDX < 2) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(extraout_EDX - 1);
        memset(__s,(uint)bVar6,uVar10);
      }
      (&(__s->kvs_config).create_if_missing)[uVar10] = false;
      return;
    }
    if (sVar3 != SBD_NONE) goto LAB_0010b549;
LAB_0010b499:
    fVar2 = fdb_close(pfStack_758);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010b53d:
      __s = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      verify_staleblock_reuse_param_test();
      goto LAB_0010b544;
    }
    fdb_shutdown();
    if (fStack_720.block_reusing_threshold == 0) {
      fStack_720.block_reusing_threshold = 100;
    }
    else {
      if (fStack_720.block_reusing_threshold != 0x41) {
        memleak_end();
        pcVar7 = "%s PASSED\n";
        if (verify_staleblock_reuse_param_test()::__test_pass != '\0') {
          pcVar7 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar7,"verify staleblock reuse param test");
        return;
      }
      fStack_720.block_reusing_threshold = 0;
    }
  } while( true );
}

Assistant:

void verify_stale_block_reuse_test() {
    TEST_INIT();

    int i, r;
    fdb_file_handle* dbfile;
    fdb_kvs_handle* db, *lazy;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    size_t fileSize1, fileSize2;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;

    fconfig.block_reusing_threshold = 20;
    status = fdb_open(&dbfile, (char *)"./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    size_t valuesize = 10240; // 10K buffer
    char *val = new char[valuesize]();
    const char *key = "key";
    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < 3000; ++i) { // 3000 * 10K
        status = fdb_set_kv(db, key, strlen(key) + 1, val, valuesize);
        TEST_STATUS(status);
        i++;
        if (!(i % 100)) { // commit 30 times
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_STATUS(status);
        }
    }

    fdb_file_info file_info;
    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize1 = file_info.file_size; // record file size first

    // open a 'lazy' handle that does not issue any forestdb calls..
    status = fdb_kvs_open(dbfile, &lazy, "lazy", &kvs_config);
    TEST_STATUS(status);

    // 100 commits which should all reuse stale blocks
    for (i = 0; i < 1000; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1,
                            val, 10);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize2 = file_info.file_size; // record file size first
    // ensure file size has not exploded and is within 30% of original filesize
    TEST_CHK(double(fileSize2) < double(fileSize1) * 1.3);

    // cleanup
    delete [] val;
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    TEST_RESULT("basic stale block reuse test");
}